

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMetaDataSetScalars
              (FmsMetaData mdata,char *mdata_name,FmsScalarType scal_type,FmsInt size,void **data)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  
  if (mdata == (FmsMetaData)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 2;
    if (((scal_type < FMS_NUM_SCALAR_TYPES) && (iVar1 = 3, size == 0 || data != (void **)0x0)) &&
       (iVar1 = FmsMetaDataClear(mdata), iVar1 == 0)) {
      if (size == 0) {
        __ptr = (void *)0x0;
      }
      else {
        __ptr = malloc(FmsScalarTypeSize[scal_type] * size);
      }
      iVar1 = 4;
      if ((size == 0) || (__ptr != (void *)0x0)) {
        iVar1 = 0;
        if (mdata_name == (char *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = strdup(mdata_name);
          if (pcVar2 == (char *)0x0) {
            free(__ptr);
            return 4;
          }
        }
        mdata->name = pcVar2;
        mdata->md_type = FMS_SCALAR;
        (mdata->sub_type).scalar_type = scal_type;
        mdata->num_entries = size;
        mdata->data = __ptr;
        *data = __ptr;
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsMetaDataSetScalars(FmsMetaData mdata, const char *mdata_name,
                          FmsScalarType scal_type, FmsInt size, void **data) {
  if (!mdata) { E_RETURN(1); }
  if (scal_type >= FMS_NUM_SCALAR_TYPES) { E_RETURN(2); }
  if (size && !data) { E_RETURN(3); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  const size_t sizeof_scal_type = FmsScalarTypeSize[scal_type];
  void *md_data = size ? malloc(size*sizeof_scal_type) : NULL;
  if (size && md_data == NULL) { E_RETURN(4); }
  // On error, call free(md_data)
  // Update mdata
  if (FmsCopyString(mdata_name, &mdata->name)) { free(md_data); E_RETURN(4); }
  mdata->md_type = FMS_SCALAR;
  mdata->sub_type.scalar_type = scal_type;
  mdata->num_entries = size;
  mdata->data = md_data;
  *data = md_data;
  return 0;
}